

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

char * nullcDebugGetInstructionSourceLocation(uint instruction)

{
  ulong uVar1;
  uint *puVar2;
  ulong uVar3;
  
  if (NULLC::linker != 0) {
    uVar1 = (ulong)*(uint *)(NULLC::linker + 0x2ec);
    if (uVar1 != 0) {
      puVar2 = (uint *)(*(long *)(NULLC::linker + 0x2e0) + 8);
      for (uVar3 = 1; uVar3 - uVar1 != 1; uVar3 = uVar3 + 1) {
        if ((puVar2[-2] == instruction) || ((uVar3 < uVar1 && (instruction < puVar2[1]))))
        goto LAB_001f50be;
        puVar2 = puVar2 + 3;
      }
      puVar2 = (uint *)(*(long *)(NULLC::linker + 0x2e0) +
                        (ulong)(*(uint *)(NULLC::linker + 0x2ec) - 1) * 0xc + 8);
LAB_001f50be:
      return (char *)(*(long *)(NULLC::linker + 0x2a0) + (ulong)*puVar2);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* nullcDebugGetInstructionSourceLocation(unsigned instruction)
{
	unsigned infoSize = 0;
	ExternSourceInfo *sourceInfo = nullcDebugSourceInfo(&infoSize);

	if(!infoSize)
		return NULL;

	const char *fullSource = nullcDebugSource();

	for(unsigned i = 0; i < infoSize; i++)
	{
		if(instruction == sourceInfo[i].instruction)
			return fullSource + sourceInfo[i].sourceOffset;

		if(i + 1 < infoSize && instruction < sourceInfo[i + 1].instruction)
			return fullSource + sourceInfo[i].sourceOffset;
	}

	return fullSource + sourceInfo[infoSize - 1].sourceOffset;
}